

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O3

Vec_Ptr_t * Psr_ManReadBlif(char *pFileName)

{
  Vec_Int_t *vTemp;
  undefined1 *puVar1;
  char cVar2;
  int *piVar3;
  size_t sVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  FILE *__stream;
  long lVar8;
  char *pcVar9;
  Psr_Man_t *p;
  Abc_Nam_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  void **ppvVar12;
  byte *pbVar13;
  ulong uVar14;
  byte *pbVar15;
  Psr_Ntk_t *pPVar16;
  uint uVar17;
  byte *pbVar18;
  long lVar19;
  long lVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    puts("Cannot open input file.");
    return (Vec_Ptr_t *)0x0;
  }
  fseek(__stream,0,2);
  lVar8 = ftell(__stream);
  rewind(__stream);
  lVar19 = lVar8 << 0x20;
  pcVar9 = (char *)malloc(lVar19 + 0x1000000000 >> 0x20);
  *pcVar9 = '\n';
  lVar20 = 1;
  fread(pcVar9 + 1,(long)(int)lVar8,1,__stream);
  fclose(__stream);
  pcVar9[lVar19 + 0x100000000 >> 0x20] = '\n';
  pcVar9[lVar19 + 0x200000000 >> 0x20] = '\0';
  p = (Psr_Man_t *)calloc(1,0x488);
  p->pName = pFileName;
  p->pBuffer = pcVar9;
  p->pLimit = pcVar9 + (long)(int)lVar8 + 3;
  p->pCur = pcVar9;
  pAVar10 = Abc_NamStart(1000,0x18);
  p->pStrs = pAVar10;
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  ppvVar12 = (void **)malloc(800);
  pVVar11->pArray = ppvVar12;
  p->vNtks = pVVar11;
  do {
    Abc_NamStrFindOrAdd(p->pStrs,s_BlifTypes[lVar20],(int *)0x0);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0xb);
  iVar6 = Abc_NamObjNumMax(p->pStrs);
  if (iVar6 != 0xb) {
    __assert_fail("Abc_NamObjNumMax(p->pStrs) == i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                  ,0x42,"void Psr_NtkAddBlifDirectives(Psr_Man_t *)");
  }
  if (p->pCur[1] != 0) {
    vTemp = &p->vTemp;
    pbVar15 = (byte *)p->pCur;
LAB_003968f9:
    pbVar13 = pbVar15 + 1;
    if (*pbVar15 != 10) {
      __assert_fail("Psr_ManIsChar(p, \'\\n\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                    ,0x180,"int Psr_ManReadLines(Psr_Man_t *)");
    }
LAB_00396905:
    while( true ) {
      p->pCur = (char *)pbVar13;
      bVar5 = *pbVar13;
      uVar14 = (ulong)bVar5;
      if (0x1f < bVar5) break;
      if ((bVar5 != 9) && (bVar5 != 0xd)) {
        if (bVar5 == 10) goto LAB_00396dee;
        goto LAB_00397ad3;
      }
LAB_00396930:
      pbVar13 = pbVar13 + 1;
    }
    if (0x2d < bVar5) {
      if (bVar5 != 0x5c) {
        if (bVar5 - 0x30 < 2) goto LAB_003969e3;
        if (bVar5 != 0x2e) goto LAB_00397ad3;
        uVar17 = (p->vCover).nSize;
        if (0 < (int)uVar17) {
          if (uVar17 == 2) {
            cVar2 = (p->vCover).pArray[1];
            bVar5 = 4;
            if (cVar2 != '0') {
              if (cVar2 != '1') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                              ,0xe9,"void Psr_ManSaveCover(Psr_Man_t *)");
              }
              bVar5 = 8;
            }
            puVar1 = &p->pNtk->field_0x4;
            *puVar1 = *puVar1 | bVar5;
            uVar17 = (p->vCover).nSize;
            if ((int)uVar17 < 1) {
              __assert_fail("Vec_StrSize(&p->vCover) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                            ,0xeb,"void Psr_ManSaveCover(Psr_Man_t *)");
            }
          }
          if (uVar17 == (p->vCover).nCap) {
            if (uVar17 < 0x10) {
              pcVar9 = (p->vCover).pArray;
              if (pcVar9 == (char *)0x0) {
                pcVar9 = (char *)malloc(0x10);
              }
              else {
                pcVar9 = (char *)realloc(pcVar9,0x10);
              }
              (p->vCover).pArray = pcVar9;
              (p->vCover).nCap = 0x10;
            }
            else {
              uVar17 = uVar17 * 2;
              pcVar9 = (p->vCover).pArray;
              if (pcVar9 == (char *)0x0) {
                pcVar9 = (char *)malloc((ulong)uVar17);
              }
              else {
                pcVar9 = (char *)realloc(pcVar9,(ulong)uVar17);
              }
              (p->vCover).pArray = pcVar9;
              (p->vCover).nCap = uVar17;
            }
          }
          else {
            pcVar9 = (p->vCover).pArray;
          }
          iVar6 = (p->vCover).nSize;
          (p->vCover).nSize = iVar6 + 1;
          pcVar9[iVar6] = '\0';
          pcVar9 = (p->vCover).pArray;
          iVar6 = strcmp(pcVar9," 0\n");
          if (iVar6 == 0) {
            iVar6 = 6;
          }
          else {
            iVar6 = strcmp(pcVar9," 1\n");
            if (iVar6 == 0) {
              iVar6 = 7;
            }
            else {
              iVar6 = strcmp(pcVar9,"1 1\n");
              if (iVar6 == 0) {
                iVar6 = 10;
              }
              else {
                iVar6 = strcmp(pcVar9,"0 1\n");
                if (iVar6 == 0) {
                  iVar6 = 0xb;
                }
                else {
                  iVar6 = strcmp(pcVar9,"11 1\n");
                  if (iVar6 == 0) {
                    iVar6 = 0xc;
                  }
                  else {
                    iVar6 = strcmp(pcVar9,"00 1\n");
                    if (iVar6 == 0) {
                      iVar6 = 0xf;
                    }
                    else {
                      iVar7 = strcmp(pcVar9,"00 0\n");
                      iVar6 = 0xe;
                      if (((iVar7 != 0) && (iVar7 = strcmp(pcVar9,"-1 1\n1- 1\n"), iVar7 != 0)) &&
                         (iVar7 = strcmp(pcVar9,"1- 1\n-1 1\n"), iVar7 != 0)) {
                        iVar7 = strcmp(pcVar9,"01 1\n10 1\n");
                        iVar6 = 0x10;
                        if ((iVar7 != 0) && (iVar7 = strcmp(pcVar9,"10 1\n01 1\n"), iVar7 != 0)) {
                          iVar7 = strcmp(pcVar9,"11 1\n00 1\n");
                          iVar6 = 0x11;
                          if ((iVar7 != 0) && (iVar7 = strcmp(pcVar9,"00 1\n11 1\n"), iVar7 != 0)) {
                            iVar6 = strcmp(pcVar9,"10 1\n");
                            if (iVar6 == 0) {
                              iVar6 = 0x12;
                            }
                            else {
                              iVar7 = strcmp(pcVar9,"01 1\n");
                              iVar6 = 0x13;
                              if (iVar7 != 0) {
                                __assert_fail("0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                              ,0x382,"Bac_ObjType_t Ptr_SopToType(char *)");
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          (p->vCover).nSize = 0;
          pPVar16 = p->pNtk;
          lVar8 = (long)(pPVar16->vObjs).nSize;
          if (((lVar8 < 1) || (iVar7 = (pPVar16->vObjs).pArray[lVar8 + -1], iVar7 < -1)) ||
             (uVar17 = iVar7 + 1, (pPVar16->vBoxes).nSize <= (int)uVar17)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar3 = (pPVar16->vBoxes).pArray;
          if (piVar3[uVar17] != 1) {
            __assert_fail("Psr_BoxNtk(p->pNtk, Psr_NtkBoxNum(p->pNtk)-1) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                          ,0xf1,"void Psr_ManSaveCover(Psr_Man_t *)");
          }
          piVar3[uVar17] = iVar6;
          pbVar13 = (byte *)p->pCur;
        }
        goto LAB_00397029;
      }
      pbVar15 = pbVar13 + 1;
      do {
        p->pCur = (char *)pbVar15;
        pbVar13 = pbVar15 + 1;
        bVar5 = *pbVar15;
        pbVar15 = pbVar13;
      } while (bVar5 != 10);
      goto LAB_00396905;
    }
    if (bVar5 == 0x20) goto LAB_00396930;
    if (bVar5 != 0x23) {
      if (bVar5 != 0x2d) {
LAB_00397ad3:
        __assert_fail("Psr_ManIsLit(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                      ,0xc9,"int Psr_ManReadCube(Psr_Man_t *)");
      }
LAB_003969e3:
      while (((byte)uVar14 < 0x32 && ((0x3200000000000U >> (uVar14 & 0x3f) & 1) != 0))) {
        p->pCur = (char *)(pbVar13 + 1);
        bVar5 = *pbVar13;
        uVar17 = (p->vCover).nSize;
        if (uVar17 == (p->vCover).nCap) {
          if ((int)uVar17 < 0x10) {
            pcVar9 = (p->vCover).pArray;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = (char *)malloc(0x10);
            }
            else {
              pcVar9 = (char *)realloc(pcVar9,0x10);
            }
            (p->vCover).pArray = pcVar9;
            (p->vCover).nCap = 0x10;
          }
          else {
            sVar4 = (ulong)uVar17 * 2;
            pcVar9 = (p->vCover).pArray;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = (char *)malloc(sVar4);
            }
            else {
              pcVar9 = (char *)realloc(pcVar9,sVar4);
            }
            (p->vCover).pArray = pcVar9;
            (p->vCover).nCap = (int)sVar4;
          }
        }
        else {
          pcVar9 = (p->vCover).pArray;
        }
        iVar6 = (p->vCover).nSize;
        (p->vCover).nSize = iVar6 + 1;
        pcVar9[iVar6] = bVar5;
        pbVar13 = (byte *)p->pCur;
        uVar14 = (ulong)*pbVar13;
      }
      do {
        bVar5 = *pbVar13;
        uVar17 = (uint)bVar5;
        if (bVar5 < 0xd) {
          if (bVar5 != 9) goto code_r0x00396ad2;
LAB_00396a80:
          pbVar13 = pbVar13 + 1;
        }
        else {
          if (uVar17 < 0x32) {
            uVar14 = (ulong)uVar17;
            if ((0x100002000U >> (uVar14 & 0x3f) & 1) != 0) goto LAB_00396a80;
            if ((0x3200000000000U >> (uVar14 & 0x3f) & 1) != 0) {
              uVar17 = (p->vCover).nSize;
              if (uVar17 == (p->vCover).nCap) {
                if ((int)uVar17 < 0x10) {
                  pcVar9 = (p->vCover).pArray;
                  if (pcVar9 == (char *)0x0) {
                    pcVar9 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar9 = (char *)realloc(pcVar9,0x10);
                  }
                  (p->vCover).pArray = pcVar9;
                  (p->vCover).nCap = 0x10;
                }
                else {
                  sVar4 = (ulong)uVar17 * 2;
                  pcVar9 = (p->vCover).pArray;
                  if (pcVar9 == (char *)0x0) {
                    pcVar9 = (char *)malloc(sVar4);
                  }
                  else {
                    pcVar9 = (char *)realloc(pcVar9,sVar4);
                  }
                  (p->vCover).pArray = pcVar9;
                  (p->vCover).nCap = (int)sVar4;
                }
              }
              else {
                pcVar9 = (p->vCover).pArray;
              }
              iVar6 = (p->vCover).nSize;
              (p->vCover).nSize = iVar6 + 1;
              pcVar9[iVar6] = ' ';
              pcVar9 = p->pCur;
              p->pCur = pcVar9 + 1;
              cVar2 = *pcVar9;
              uVar17 = (p->vCover).nSize;
              if (uVar17 == (p->vCover).nCap) {
                if ((int)uVar17 < 0x10) {
                  pcVar9 = (p->vCover).pArray;
                  if (pcVar9 == (char *)0x0) {
                    pcVar9 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar9 = (char *)realloc(pcVar9,0x10);
                  }
                  (p->vCover).pArray = pcVar9;
                  (p->vCover).nCap = 0x10;
                }
                else {
                  sVar4 = (ulong)uVar17 * 2;
                  pcVar9 = (p->vCover).pArray;
                  if (pcVar9 == (char *)0x0) {
                    pcVar9 = (char *)malloc(sVar4);
                  }
                  else {
                    pcVar9 = (char *)realloc(pcVar9,sVar4);
                  }
                  (p->vCover).pArray = pcVar9;
                  (p->vCover).nCap = (int)sVar4;
                }
              }
              else {
                pcVar9 = (p->vCover).pArray;
              }
              iVar6 = (p->vCover).nSize;
              (p->vCover).nSize = iVar6 + 1;
              pcVar9[iVar6] = cVar2;
              uVar17 = (p->vCover).nSize;
              if (uVar17 == (p->vCover).nCap) {
                if ((int)uVar17 < 0x10) {
                  pcVar9 = (p->vCover).pArray;
                  if (pcVar9 == (char *)0x0) {
                    pcVar9 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar9 = (char *)realloc(pcVar9,0x10);
                  }
                  (p->vCover).pArray = pcVar9;
                  (p->vCover).nCap = 0x10;
                }
                else {
                  sVar4 = (ulong)uVar17 * 2;
                  pcVar9 = (p->vCover).pArray;
                  if (pcVar9 == (char *)0x0) {
                    pcVar9 = (char *)malloc(sVar4);
                  }
                  else {
                    pcVar9 = (char *)realloc(pcVar9,sVar4);
                  }
                  (p->vCover).pArray = pcVar9;
                  (p->vCover).nCap = (int)sVar4;
                }
              }
              else {
                pcVar9 = (p->vCover).pArray;
              }
              iVar6 = (p->vCover).nSize;
              (p->vCover).nSize = iVar6 + 1;
              pcVar9[iVar6] = '\n';
              pbVar15 = (byte *)p->pCur;
              goto LAB_00396d52;
            }
            if (uVar14 == 0x23) goto LAB_00396b3b;
          }
          if (uVar17 != 0x5c) goto LAB_003975b5;
          pbVar15 = pbVar13 + 1;
          do {
            p->pCur = (char *)pbVar15;
            pbVar13 = pbVar15 + 1;
            bVar5 = *pbVar15;
            pbVar15 = pbVar13;
          } while (bVar5 != 10);
        }
        p->pCur = (char *)pbVar13;
      } while( true );
    }
    do {
      pbVar13 = pbVar13 + 1;
      p->pCur = (char *)pbVar13;
    } while (*pbVar13 != 10);
    goto LAB_00396dee;
  }
  goto LAB_0039760e;
LAB_00397029:
  bVar5 = *pbVar13;
  if (bVar5 < 0x20) {
    if ((bVar5 != 9) && (bVar5 != 0xd)) goto LAB_0039706a;
LAB_00397061:
    pbVar13 = pbVar13 + 1;
  }
  else {
    if (bVar5 == 0x20) goto LAB_00397061;
    if (bVar5 != 0x5c) {
      if (bVar5 == 0x23) goto LAB_003975e3;
      goto LAB_0039707e;
    }
    pbVar15 = pbVar13 + 1;
    do {
      p->pCur = (char *)pbVar15;
      pbVar13 = pbVar15 + 1;
      bVar5 = *pbVar15;
      pbVar15 = pbVar13;
    } while (bVar5 != 10);
  }
  p->pCur = (char *)pbVar13;
  goto LAB_00397029;
LAB_0039706a:
  if (bVar5 == 10) goto LAB_003975f0;
LAB_0039707e:
  lVar8 = 0;
  pbVar15 = pbVar13;
  while( true ) {
    pbVar18 = pbVar15 + 1;
    if (((bVar5 < 0x3e) && ((0x2000000900002600U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) ||
       (bVar5 == 0x5c)) break;
    p->pCur = (char *)pbVar18;
    bVar5 = *pbVar18;
    lVar8 = lVar8 + -1;
    pbVar15 = pbVar18;
  }
  if (lVar8 == 0) goto LAB_003975f0;
  iVar7 = 0;
  iVar6 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar13,(char *)pbVar15,(int *)0x0);
  switch(iVar6) {
  case 1:
    if (p->pNtk == (Psr_Ntk_t *)0x0) {
      pbVar15 = (byte *)p->pCur;
      do {
        bVar5 = *pbVar15;
        if (bVar5 < 0x20) {
          if ((bVar5 != 9) && (bVar5 != 0xd)) goto LAB_003973af;
LAB_00397131:
          pbVar15 = pbVar15 + 1;
        }
        else {
          if (bVar5 == 0x20) goto LAB_00397131;
          if (bVar5 != 0x5c) {
            if (bVar5 == 0x23) goto LAB_003977c1;
            goto LAB_003973c3;
          }
          pbVar13 = pbVar15 + 1;
          do {
            p->pCur = (char *)pbVar13;
            pbVar15 = pbVar13 + 1;
            bVar5 = *pbVar13;
            pbVar13 = pbVar15;
          } while (bVar5 != 10);
        }
        p->pCur = (char *)pbVar15;
      } while( true );
    }
    if (p->ErrorStr[0] != '\0') goto LAB_00397b4f;
    builtin_strncpy(p->ErrorStr,"Parsing previous model is unfinished.",0x26);
    goto LAB_0039760e;
  case 2:
    iVar6 = Psr_ManReadList(p,&p->pNtk->vOrder,3);
    if (iVar6 != 0) goto LAB_0039760e;
    if (0 < (p->vTemp).nSize) {
      pPVar16 = p->pNtk;
      lVar8 = 0;
      do {
        Vec_IntPush(&pPVar16->vInouts,(p->vTemp).pArray[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 < (p->vTemp).nSize);
    }
    break;
  case 3:
    iVar6 = Psr_ManReadList(p,&p->pNtk->vOrder,1);
    if (iVar6 != 0) goto LAB_0039760e;
    if (0 < (p->vTemp).nSize) {
      pPVar16 = p->pNtk;
      lVar8 = 0;
      do {
        Vec_IntPush(&pPVar16->vInputs,(p->vTemp).pArray[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 < (p->vTemp).nSize);
    }
    break;
  case 4:
    iVar6 = Psr_ManReadList(p,&p->pNtk->vOrder,2);
    if (iVar6 != 0) goto LAB_0039760e;
    if (0 < (p->vTemp).nSize) {
      pPVar16 = p->pNtk;
      lVar8 = 0;
      do {
        Vec_IntPush(&pPVar16->vOutputs,(p->vTemp).pArray[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 < (p->vTemp).nSize);
    }
    break;
  case 5:
    (p->vTemp).nSize = 0;
LAB_00397141:
    pbVar15 = (byte *)p->pCur;
    do {
      bVar5 = *pbVar15;
      if (bVar5 < 0x20) {
        if ((bVar5 != 9) && (bVar5 != 0xd)) goto LAB_00397186;
LAB_0039717d:
        pbVar15 = pbVar15 + 1;
      }
      else {
        if (bVar5 == 0x20) goto LAB_0039717d;
        if (bVar5 != 0x5c) {
          if (bVar5 == 0x23) goto LAB_0039737e;
          goto LAB_0039719a;
        }
        pbVar13 = pbVar15 + 1;
        do {
          p->pCur = (char *)pbVar13;
          pbVar15 = pbVar13 + 1;
          bVar5 = *pbVar13;
          pbVar13 = pbVar15;
        } while (bVar5 != 10);
      }
      p->pCur = (char *)pbVar15;
    } while( true );
  case 7:
    iVar7 = 1;
  case 6:
    iVar6 = Psr_ManReadBox(p,iVar7);
    if (iVar6 != 0) goto LAB_0039760e;
    break;
  case 8:
    pbVar15 = (byte *)p->pCur;
    goto LAB_00397835;
  case 9:
    pbVar15 = (byte *)p->pCur;
    goto LAB_00397881;
  case 10:
    if (p->pNtk != (Psr_Ntk_t *)0x0) {
      p->pNtk = (Psr_Ntk_t *)0x0;
      pbVar15 = (byte *)p->pCur;
      do {
        bVar5 = *pbVar15;
        if (bVar5 < 0x20) {
          if ((bVar5 != 9) && (bVar5 != 0xd)) goto LAB_003973f3;
LAB_00397372:
          pbVar15 = pbVar15 + 1;
        }
        else {
          if (bVar5 == 0x20) goto LAB_00397372;
          if (bVar5 != 0x5c) {
            if (bVar5 == 0x23) goto LAB_0039740d;
            goto LAB_00397793;
          }
          pbVar13 = pbVar15 + 1;
          do {
            p->pCur = (char *)pbVar13;
            pbVar15 = pbVar13 + 1;
            bVar5 = *pbVar13;
            pbVar13 = pbVar15;
          } while (bVar5 != 10);
        }
        p->pCur = (char *)pbVar15;
      } while( true );
    }
    if (p->ErrorStr[0] != '\0') goto LAB_00397b4f;
    builtin_strncpy(p->ErrorStr + 0xf,"without .model.",0x10);
    uVar21._0_1_ = 'D';
    uVar21._1_1_ = 'i';
    uVar21._2_1_ = 'r';
    uVar21._3_1_ = 'e';
    uVar22._0_1_ = 'c';
    uVar22._1_1_ = 't';
    uVar22._2_1_ = 'i';
    uVar22._3_1_ = 'v';
    uVar23._0_1_ = 'e';
    uVar23._1_1_ = ' ';
    uVar23._2_1_ = '.';
    uVar23._3_1_ = 'e';
    uVar24._0_1_ = 'n';
    uVar24._1_1_ = 'd';
    uVar24._2_1_ = ' ';
    uVar24._3_1_ = 'w';
    goto LAB_003975db;
  default:
    goto switchD_003970e1_default;
  }
LAB_00396dea:
  pbVar13 = (byte *)p->pCur;
LAB_00396dee:
  pbVar15 = pbVar13;
  if (pbVar13[1] == 0) goto LAB_0039760e;
  goto LAB_003968f9;
LAB_0039740d:
  do {
    pbVar15 = pbVar15 + 1;
    p->pCur = (char *)pbVar15;
  } while (*pbVar15 != 10);
  goto LAB_00396dea;
LAB_003973f3:
  if (bVar5 != 10) {
LAB_00397793:
    if (p->ErrorStr[0] != '\0') goto LAB_00397b4f;
    builtin_strncpy(p->ErrorStr + 0xf,"s on .end line.",0x10);
    uVar21._0_1_ = 'T';
    uVar21._1_1_ = 'r';
    uVar21._2_1_ = 'a';
    uVar21._3_1_ = 'i';
    uVar22._0_1_ = 'l';
    uVar22._1_1_ = 'i';
    uVar22._2_1_ = 'n';
    uVar22._3_1_ = 'g';
    uVar23._0_1_ = ' ';
    uVar23._1_1_ = 's';
    uVar23._2_1_ = 'y';
    uVar23._3_1_ = 'm';
    uVar24._0_1_ = 'b';
    uVar24._1_1_ = 'o';
    uVar24._2_1_ = 'l';
    uVar24._3_1_ = 's';
    goto LAB_003975db;
  }
  goto LAB_00396dea;
LAB_00397881:
  bVar5 = *pbVar15;
  if (bVar5 < 0x20) {
    if ((bVar5 != 9) && (bVar5 != 0xd)) goto LAB_00397983;
LAB_003978c0:
    pbVar15 = pbVar15 + 1;
  }
  else {
    if (bVar5 == 0x20) goto LAB_003978c0;
    if (bVar5 != 0x5c) {
      if (bVar5 == 0x23) goto LAB_0039799d;
      goto LAB_00397a34;
    }
    pbVar13 = pbVar15 + 1;
    do {
      p->pCur = (char *)pbVar13;
      pbVar15 = pbVar13 + 1;
      bVar5 = *pbVar13;
      pbVar13 = pbVar15;
    } while (bVar5 != 10);
  }
  p->pCur = (char *)pbVar15;
  goto LAB_00397881;
LAB_00397983:
  if (bVar5 == 10) goto LAB_00397aa1;
LAB_00397a34:
  lVar8 = 0;
  pbVar13 = pbVar15;
  while( true ) {
    pbVar18 = pbVar13 + 1;
    if (((bVar5 < 0x3e) && ((0x2000000900002600U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) ||
       (bVar5 == 0x5c)) break;
    p->pCur = (char *)pbVar18;
    bVar5 = *pbVar18;
    lVar8 = lVar8 + -1;
    pbVar13 = pbVar18;
  }
  if (lVar8 == 0) goto LAB_00397aa1;
  iVar6 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar15,(char *)pbVar13,(int *)0x0);
  (p->vTemp).nSize = 0;
  if (iVar6 != 0) goto LAB_00397a82;
  goto LAB_00397aa8;
LAB_0039799d:
  do {
    pbVar15 = pbVar15 + 1;
    p->pCur = (char *)pbVar15;
  } while (*pbVar15 != 10);
LAB_00397aa1:
  (p->vTemp).nSize = 0;
LAB_00397aa8:
  if (p->ErrorStr[0] != '\0') goto LAB_00397b4f;
  builtin_strncpy(p->ErrorStr + 10,"d .short input.",0x10);
  uVar21._0_1_ = 'C';
  uVar21._1_1_ = 'a';
  uVar21._2_1_ = 'n';
  uVar21._3_1_ = 'n';
  uVar22._0_1_ = 'o';
  uVar22._1_1_ = 't';
  uVar22._2_1_ = ' ';
  uVar22._3_1_ = 'r';
  uVar23._0_1_ = 'e';
  uVar23._1_1_ = 'a';
  uVar23._2_1_ = 'd';
  uVar23._3_1_ = ' ';
  uVar24._0_1_ = '.';
  uVar24._1_1_ = 's';
  uVar24._2_1_ = 'h';
  uVar24._3_1_ = 'o';
  goto LAB_003975db;
LAB_00397835:
  bVar5 = *pbVar15;
  if (bVar5 < 0x20) {
    if ((bVar5 != 9) && (bVar5 != 0xd)) goto LAB_00397961;
LAB_00397874:
    pbVar15 = pbVar15 + 1;
  }
  else {
    if (bVar5 == 0x20) goto LAB_00397874;
    if (bVar5 != 0x5c) {
      if (bVar5 == 0x23) goto LAB_00397974;
      goto LAB_003979af;
    }
    pbVar13 = pbVar15 + 1;
    do {
      p->pCur = (char *)pbVar13;
      pbVar15 = pbVar13 + 1;
      bVar5 = *pbVar13;
      pbVar13 = pbVar15;
    } while (bVar5 != 10);
  }
  p->pCur = (char *)pbVar15;
  goto LAB_00397835;
LAB_00397961:
  if (bVar5 == 10) goto LAB_00397a02;
LAB_003979af:
  lVar8 = 0;
  pbVar13 = pbVar15;
  while( true ) {
    pbVar18 = pbVar13 + 1;
    if (((bVar5 < 0x3e) && ((0x2000000900002600U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) ||
       (bVar5 == 0x5c)) break;
    p->pCur = (char *)pbVar18;
    bVar5 = *pbVar18;
    lVar8 = lVar8 + -1;
    pbVar13 = pbVar18;
  }
  if (lVar8 == 0) goto LAB_00397a02;
  iVar6 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar15,(char *)pbVar13,(int *)0x0);
  (p->vTemp).nSize = 0;
  if (iVar6 != 0) {
LAB_00397a82:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  goto LAB_00397a09;
LAB_00397186:
  if (bVar5 == 10) goto LAB_0039738b;
LAB_0039719a:
  lVar8 = 0;
  pbVar13 = pbVar15;
  while( true ) {
    pbVar18 = pbVar13 + 1;
    if (((bVar5 < 0x3e) && ((0x2000000900002600U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) ||
       (bVar5 == 0x5c)) break;
    p->pCur = (char *)pbVar18;
    bVar5 = *pbVar18;
    lVar8 = lVar8 + -1;
    pbVar13 = pbVar18;
  }
  if ((lVar8 == 0) ||
     (iVar6 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar15,(char *)pbVar13,(int *)0x0),
     iVar6 == 0)) goto LAB_0039738b;
  Vec_IntPush(vTemp,0);
  Vec_IntPush(vTemp,iVar6);
  goto LAB_00397141;
LAB_0039737e:
  do {
    pbVar15 = pbVar15 + 1;
    p->pCur = (char *)pbVar15;
  } while (*pbVar15 != 10);
LAB_0039738b:
  if ((p->vTemp).nSize == 0) {
    if (p->ErrorStr[0] != '\0') goto LAB_00397b4f;
    builtin_strncpy(p->ErrorStr,"Signal list is empty.",0x16);
    goto LAB_0039760e;
  }
  Psr_NtkAddBox(p->pNtk,1,0,vTemp);
  goto LAB_00396dea;
LAB_003973af:
  if (bVar5 != 10) {
LAB_003973c3:
    lVar8 = 0;
    pbVar13 = pbVar15;
    while( true ) {
      pbVar18 = pbVar13 + 1;
      if (((bVar5 < 0x3e) && ((0x2000000900002600U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) ||
         (bVar5 == 0x5c)) break;
      p->pCur = (char *)pbVar18;
      bVar5 = *pbVar18;
      lVar8 = lVar8 + -1;
      pbVar13 = pbVar18;
    }
    if ((lVar8 != 0) &&
       (iVar6 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar15,(char *)pbVar13,(int *)0x0),
       iVar6 != 0)) {
      if (p->pNtk != (Psr_Ntk_t *)0x0) {
        __assert_fail("p->pNtk == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrs.h"
                      ,0xb4,"void Psr_ManInitializeNtk(Psr_Man_t *, int, int)");
      }
      pPVar16 = (Psr_Ntk_t *)calloc(1,0xe0);
      p->pNtk = pPVar16;
      pPVar16->iModuleName = iVar6;
      pAVar10 = Abc_NamRef(p->pStrs);
      pPVar16 = p->pNtk;
      pPVar16->pStrs = pAVar10;
      pVVar11 = p->vNtks;
      uVar17 = pVVar11->nSize;
      if (uVar17 == pVVar11->nCap) {
        if ((int)uVar17 < 0x10) {
          if (pVVar11->pArray == (void **)0x0) {
            ppvVar12 = (void **)malloc(0x80);
          }
          else {
            ppvVar12 = (void **)realloc(pVVar11->pArray,0x80);
          }
          pVVar11->pArray = ppvVar12;
          pVVar11->nCap = 0x10;
        }
        else {
          if (pVVar11->pArray == (void **)0x0) {
            ppvVar12 = (void **)malloc((ulong)uVar17 << 4);
          }
          else {
            ppvVar12 = (void **)realloc(pVVar11->pArray,(ulong)uVar17 << 4);
          }
          pVVar11->pArray = ppvVar12;
          pVVar11->nCap = uVar17 * 2;
        }
      }
      else {
        ppvVar12 = pVVar11->pArray;
      }
      iVar6 = pVVar11->nSize;
      pVVar11->nSize = iVar6 + 1;
      ppvVar12[iVar6] = pPVar16;
      pbVar15 = (byte *)p->pCur;
      do {
        bVar5 = *pbVar15;
        if (bVar5 < 0x20) {
          if ((bVar5 != 9) && (bVar5 != 0xd)) goto LAB_00397542;
LAB_00397539:
          pbVar15 = pbVar15 + 1;
        }
        else {
          if (bVar5 == 0x20) goto LAB_00397539;
          if (bVar5 != 0x5c) {
            if (bVar5 == 0x23) goto LAB_0039755c;
            goto LAB_003977ff;
          }
          pbVar13 = pbVar15 + 1;
          do {
            p->pCur = (char *)pbVar13;
            pbVar15 = pbVar13 + 1;
            bVar5 = *pbVar13;
            pbVar13 = pbVar15;
          } while (bVar5 != 10);
        }
        p->pCur = (char *)pbVar15;
      } while( true );
    }
  }
  goto LAB_003977ce;
LAB_0039755c:
  do {
    pbVar15 = pbVar15 + 1;
    p->pCur = (char *)pbVar15;
  } while (*pbVar15 != 10);
  goto LAB_00396dea;
LAB_00397542:
  if (bVar5 != 10) {
LAB_003977ff:
    if (p->ErrorStr[0] != '\0') goto LAB_00397b4f;
    builtin_strncpy(p->ErrorStr,"Trailing symbols on .model line.",0x21);
    goto LAB_0039760e;
  }
  goto LAB_00396dea;
LAB_003977c1:
  do {
    pbVar15 = pbVar15 + 1;
    p->pCur = (char *)pbVar15;
  } while (*pbVar15 != 10);
LAB_003977ce:
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Cannot read model name.",0x18);
    goto LAB_0039760e;
  }
  goto LAB_00397b4f;
LAB_003975e3:
  do {
    pbVar13 = pbVar13 + 1;
    p->pCur = (char *)pbVar13;
  } while (*pbVar13 != 10);
LAB_003975f0:
  iVar6 = 0;
switchD_003970e1_default:
  pcVar9 = Abc_NamStr(p->pStrs,iVar6);
  printf("Cannot read directive \"%s\".\n",pcVar9);
  goto LAB_0039760e;
LAB_00396d52:
  bVar5 = *pbVar15;
  if (bVar5 < 0x20) {
    if ((bVar5 != 9) && (bVar5 != 0xd)) goto LAB_00396d91;
LAB_00396d88:
    pbVar15 = pbVar15 + 1;
  }
  else {
    if (bVar5 == 0x20) goto LAB_00396d88;
    if (bVar5 != 0x5c) {
      if (bVar5 == 0x23) goto LAB_00396da7;
      goto LAB_0039758d;
    }
    pbVar13 = pbVar15 + 1;
    do {
      p->pCur = (char *)pbVar13;
      pbVar15 = pbVar13 + 1;
      bVar5 = *pbVar13;
      pbVar13 = pbVar15;
    } while (bVar5 != 10);
  }
  p->pCur = (char *)pbVar15;
  goto LAB_00396d52;
LAB_00396da7:
  do {
    pbVar15 = pbVar15 + 1;
    p->pCur = (char *)pbVar15;
  } while (*pbVar15 != 10);
  goto LAB_00396dea;
LAB_00396d91:
  if (bVar5 != 10) {
LAB_0039758d:
    if (p->ErrorStr[0] != '\0') goto LAB_00397b4f;
    builtin_strncpy(p->ErrorStr + 9,"ad end of cube.",0x10);
    uVar21._0_1_ = 'C';
    uVar21._1_1_ = 'a';
    uVar21._2_1_ = 'n';
    uVar21._3_1_ = 'n';
    uVar22._0_1_ = 'o';
    uVar22._1_1_ = 't';
    uVar22._2_1_ = ' ';
    uVar22._3_1_ = 'r';
    uVar23._0_1_ = 'e';
    uVar23._1_1_ = 'a';
    uVar23._2_1_ = 'd';
    uVar23._3_1_ = ' ';
    uVar24._0_1_ = 'e';
    uVar24._1_1_ = 'n';
    uVar24._2_1_ = 'd';
    uVar24._3_1_ = ' ';
    goto LAB_003975db;
  }
  goto LAB_00396dea;
LAB_00396b3b:
  do {
    pbVar13 = pbVar13 + 1;
    p->pCur = (char *)pbVar13;
  } while (*pbVar13 != 10);
  goto LAB_00396b48;
code_r0x00396ad2:
  if (uVar17 != 10) {
LAB_003975b5:
    if (p->ErrorStr[0] != '\0') goto LAB_00397b4f;
    builtin_strncpy(p->ErrorStr + 0xc,"output literal.",0x10);
    uVar21._0_1_ = 'C';
    uVar21._1_1_ = 'a';
    uVar21._2_1_ = 'n';
    uVar21._3_1_ = 'n';
    uVar22._0_1_ = 'o';
    uVar22._1_1_ = 't';
    uVar22._2_1_ = ' ';
    uVar22._3_1_ = 'r';
    uVar23._0_1_ = 'e';
    uVar23._1_1_ = 'a';
    uVar23._2_1_ = 'd';
    uVar23._3_1_ = ' ';
    uVar24._0_1_ = 'o';
    uVar24._1_1_ = 'u';
    uVar24._2_1_ = 't';
    uVar24._3_1_ = 'p';
    goto LAB_003975db;
  }
LAB_00396b48:
  if ((p->vCover).nSize != 1) {
    if (p->ErrorStr[0] != '\0') goto LAB_00397b4f;
    builtin_strncpy(p->ErrorStr,"Cannot read cube.",0x12);
    goto LAB_0039760e;
  }
  pcVar9 = (p->vCover).pArray;
  cVar2 = *pcVar9;
  iVar6 = 1;
  if ((p->vCover).nCap == 1) {
    pcVar9 = (char *)realloc(pcVar9,0x10);
    (p->vCover).pArray = pcVar9;
    (p->vCover).nCap = 0x10;
    iVar6 = (p->vCover).nSize;
  }
  (p->vCover).nSize = iVar6 + 1;
  pcVar9[iVar6] = cVar2;
  if ((p->vCover).nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
  }
  *(p->vCover).pArray = ' ';
  uVar17 = (p->vCover).nSize;
  if (uVar17 == (p->vCover).nCap) {
    if ((int)uVar17 < 0x10) {
      pcVar9 = (p->vCover).pArray;
      if (pcVar9 == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(pcVar9,0x10);
      }
      (p->vCover).pArray = pcVar9;
      (p->vCover).nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar17 * 2;
      pcVar9 = (p->vCover).pArray;
      if (pcVar9 == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar4);
      }
      else {
        pcVar9 = (char *)realloc(pcVar9,sVar4);
      }
      (p->vCover).pArray = pcVar9;
      (p->vCover).nCap = (int)sVar4;
    }
  }
  else {
    pcVar9 = (p->vCover).pArray;
  }
  iVar6 = (p->vCover).nSize;
  (p->vCover).nSize = iVar6 + 1;
  pcVar9[iVar6] = '\n';
  goto LAB_00396dea;
LAB_00397974:
  do {
    pbVar15 = pbVar15 + 1;
    p->pCur = (char *)pbVar15;
  } while (*pbVar15 != 10);
LAB_00397a02:
  (p->vTemp).nSize = 0;
LAB_00397a09:
  if (p->ErrorStr[0] != '\0') {
LAB_00397b4f:
    __assert_fail("!p->ErrorStr[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrs.h"
                  ,0x9d,"int Psr_ManErrorSet(Psr_Man_t *, char *, int)");
  }
  builtin_strncpy(p->ErrorStr + 9,"ad latch input.",0x10);
  uVar21._0_1_ = 'C';
  uVar21._1_1_ = 'a';
  uVar21._2_1_ = 'n';
  uVar21._3_1_ = 'n';
  uVar22._0_1_ = 'o';
  uVar22._1_1_ = 't';
  uVar22._2_1_ = ' ';
  uVar22._3_1_ = 'r';
  uVar23._0_1_ = 'e';
  uVar23._1_1_ = 'a';
  uVar23._2_1_ = 'd';
  uVar23._3_1_ = ' ';
  uVar24._0_1_ = 'l';
  uVar24._1_1_ = 'a';
  uVar24._2_1_ = 't';
  uVar24._3_1_ = 'c';
LAB_003975db:
  *(undefined4 *)p->ErrorStr = uVar21;
  *(undefined4 *)(p->ErrorStr + 4) = uVar22;
  *(undefined4 *)(p->ErrorStr + 8) = uVar23;
  *(undefined4 *)(p->ErrorStr + 0xc) = uVar24;
LAB_0039760e:
  if (p->ErrorStr[0] == '\0') {
    pVVar11 = p->vNtks;
    p->vNtks = (Vec_Ptr_t *)0x0;
  }
  else {
    pcVar9 = p->pBuffer;
    uVar14 = 0;
    if (pcVar9 < p->pCur) {
      uVar14 = 0;
      do {
        uVar14 = (ulong)((int)uVar14 + (uint)(*pcVar9 == '\n'));
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != p->pCur);
    }
    pVVar11 = (Vec_Ptr_t *)0x0;
    printf("Line %d: %s\n",uVar14,p->ErrorStr);
  }
  if (p->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pStrs);
  }
  if (p->vNtks != (Vec_Ptr_t *)0x0) {
    Psr_ManVecFree(p->vNtks);
  }
  pcVar9 = (p->vCover).pArray;
  if (pcVar9 != (char *)0x0) {
    free(pcVar9);
    (p->vCover).pArray = (char *)0x0;
  }
  (p->vCover).nCap = 0;
  (p->vCover).nSize = 0;
  piVar3 = (p->vTemp).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vTemp).pArray = (int *)0x0;
  }
  (p->vTemp).nCap = 0;
  (p->vTemp).nSize = 0;
  piVar3 = (p->vTemp2).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vTemp2).pArray = (int *)0x0;
  }
  (p->vTemp2).nCap = 0;
  (p->vTemp2).nSize = 0;
  piVar3 = (p->vKnown).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vKnown).pArray = (int *)0x0;
  }
  (p->vKnown).nCap = 0;
  (p->vKnown).nSize = 0;
  piVar3 = (p->vFailed).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vFailed).pArray = (int *)0x0;
  }
  (p->vFailed).nCap = 0;
  (p->vFailed).nSize = 0;
  piVar3 = (p->vSucceeded).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vSucceeded).pArray = (int *)0x0;
  }
  (p->vSucceeded).nCap = 0;
  (p->vSucceeded).nSize = 0;
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
  }
  free(p);
  return pVVar11;
}

Assistant:

Vec_Ptr_t * Psr_ManReadBlif( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Psr_Man_t * p = Psr_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Psr_NtkAddBlifDirectives( p );
    Psr_ManReadLines( p );
    if ( Psr_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Psr_ManFree( p );
    return vPrs;
}